

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O1

char * absl::lts_20240722::str_format_internal::ConsumeConversion<false>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  Flags FVar1;
  FormatConversionChar FVar2;
  UnboundConversion *pUVar3;
  int *piVar4;
  char *pcVar5;
  Flags FVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  ConvTag tag;
  ConvTag tag_1;
  ConvTag local_49;
  UnboundConversion *local_48;
  int *local_40;
  char *local_38;
  
  if (pos == end) {
    return (char *)0x0;
  }
  if (conv->flags != kBasic) {
    __assert_fail("conv->flags == Flags::kBasic",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xee,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                 );
  }
  bVar10 = *pos;
  pbVar13 = (byte *)(pos + 1);
  pUVar3 = conv;
  piVar4 = next_arg;
  pcVar5 = pos;
  if ('@' < (char)bVar10) goto LAB_0010f540;
  do {
    local_38 = pcVar5;
    local_40 = piVar4;
    local_48 = pUVar3;
    pUVar3 = local_48;
    if ('0' < (char)bVar10) goto LAB_0010f38f;
    local_49.tag_ = ConvTagHolder::value[bVar10].tag_;
    iVar8 = 5;
    if ((local_49.tag_ & 0xe0) == 0xc0) {
      FVar1 = local_48->flags;
      FVar6 = ConvTag::as_flags(&local_49);
      pUVar3->flags = FVar6 | FVar1;
      if (pbVar13 == (byte *)end) {
        iVar8 = 1;
      }
      else {
        bVar10 = *pbVar13;
        pbVar13 = pbVar13 + 1;
        iVar8 = 0;
      }
    }
    pUVar3 = local_48;
    piVar4 = local_40;
    pcVar5 = local_38;
  } while (iVar8 == 0);
  if (iVar8 != 5) {
    return (char *)0x0;
  }
LAB_0010f38f:
  next_arg = local_40;
  conv = local_48;
  if ((char)bVar10 < ':') {
    if ((char)bVar10 < '0') {
      if (bVar10 == 0x2a) {
        local_48->flags = local_48->flags | kNonBasic;
        if (pbVar13 == (byte *)end) {
          return (char *)0x0;
        }
        bVar10 = *pbVar13;
        iVar8 = *local_40;
        *local_40 = iVar8 + 1;
        if (iVar8 < 0) goto LAB_0010f6de;
        pbVar13 = pbVar13 + 1;
        (local_48->width).value_ = -2 - iVar8;
      }
      local_48 = (UnboundConversion *)0x0;
    }
    else {
      iVar8 = bVar10 - 0x30;
      pbVar11 = pbVar13;
      if (pbVar13 != (byte *)end) {
        pbVar12 = pbVar13 + 9;
        iVar9 = -8;
        do {
          bVar10 = *pbVar13;
          if ((byte)(bVar10 - 0x3a) < 0xf6) {
            pbVar11 = pbVar13 + 1;
            break;
          }
          pbVar11 = pbVar12;
          if (iVar9 == 0) break;
          pbVar13 = pbVar13 + 1;
          iVar8 = (int)(char)bVar10 + iVar8 * 10 + -0x30;
          iVar9 = iVar9 + 1;
          pbVar11 = (byte *)end;
        } while (pbVar13 != (byte *)end);
      }
      if (bVar10 == 0x24) {
        if (*local_40 != 0) goto LAB_0010f476;
        *local_40 = -1;
        local_48 = (UnboundConversion *)ConsumeConversion<true>(local_38,end,local_48,local_40);
      }
      else {
        local_48->flags = local_48->flags | kNonBasic;
        if (iVar8 < 0) goto LAB_0010f6bf;
        (local_48->width).value_ = iVar8;
LAB_0010f476:
        local_48 = (UnboundConversion *)0x0;
      }
      pbVar13 = pbVar11;
      if (bVar10 == 0x24) {
        return (char *)local_48;
      }
    }
  }
  else {
    local_48 = (UnboundConversion *)0x0;
  }
  if (bVar10 == 0x2e) {
    conv->flags = conv->flags | kNonBasic;
    if (pbVar13 == (byte *)end) {
      return (char *)0x0;
    }
    pbVar11 = pbVar13 + 1;
    bVar10 = *pbVar13;
    if ((byte)(bVar10 - 0x30) < 10) {
      iVar8 = bVar10 - 0x30;
      pbVar12 = pbVar11;
      if (pbVar11 != (byte *)end) {
        iVar9 = -8;
        do {
          bVar10 = *pbVar11;
          if ((byte)(bVar10 - 0x3a) < 0xf6) {
            pbVar12 = pbVar11 + 1;
            break;
          }
          pbVar12 = pbVar13 + 10;
          if (iVar9 == 0) break;
          pbVar11 = pbVar11 + 1;
          iVar8 = (int)(char)bVar10 + iVar8 * 10 + -0x30;
          iVar9 = iVar9 + 1;
          pbVar12 = (byte *)end;
        } while (pbVar11 != (byte *)end);
      }
      if (iVar8 < 0) {
LAB_0010f6bf:
        __assert_fail("value >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                      ,0x2e,
                      "void absl::str_format_internal::UnboundConversion::InputValue::set_value(int)"
                     );
      }
      (conv->precision).value_ = iVar8;
      pbVar13 = pbVar12;
    }
    else if (bVar10 == 0x2a) {
      if (pbVar11 == (byte *)end) {
        return (char *)0x0;
      }
      bVar10 = *pbVar11;
      iVar8 = *next_arg;
      *next_arg = iVar8 + 1;
      if (iVar8 < 0) {
LAB_0010f6de:
        __assert_fail("value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                      ,0x39,
                      "void absl::str_format_internal::UnboundConversion::InputValue::set_from_arg(int)"
                     );
      }
      pbVar13 = pbVar13 + 2;
      (conv->precision).value_ = -2 - iVar8;
    }
    else {
      (conv->precision).value_ = 0;
      pbVar13 = pbVar11;
    }
  }
LAB_0010f540:
  FVar2 = ConvTagHolder::value[bVar10].tag_;
  if (((bVar10 == 0x76) && (conv->flags != kBasic)) || ((char)FVar2 < '\0')) {
    return (char *)0x0;
  }
  bVar7 = CheckFastPathSetting(conv);
  if (!bVar7) {
    __assert_fail("CheckFastPathSetting(*conv)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x14d,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                 );
  }
  if ((char)FVar2 < '\0') {
    __assert_fail("is_conv()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,99,"FormatConversionChar absl::str_format_internal::ConvTag::as_conv() const");
  }
  conv->conv = FVar2;
  iVar8 = *next_arg;
  *next_arg = iVar8 + 1;
  conv->arg_position = iVar8 + 1;
  return (char *)pbVar13;
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}